

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scale.h
# Opt level: O0

void Gs::Details::Scale3x3<Gs::AffineMatrix4T<float>,float>
               (AffineMatrix4T<float> *m,Vector3T<float> *v)

{
  float fVar1;
  float *pfVar2;
  Vector3T<float> *v_local;
  AffineMatrix4T<float> *m_local;
  
  fVar1 = v->x;
  pfVar2 = AffineMatrix4T<float>::At(m,0,0);
  *pfVar2 = fVar1 * *pfVar2;
  fVar1 = v->x;
  pfVar2 = AffineMatrix4T<float>::At(m,1,0);
  *pfVar2 = fVar1 * *pfVar2;
  fVar1 = v->x;
  pfVar2 = AffineMatrix4T<float>::At(m,2,0);
  *pfVar2 = fVar1 * *pfVar2;
  fVar1 = v->y;
  pfVar2 = AffineMatrix4T<float>::At(m,0,1);
  *pfVar2 = fVar1 * *pfVar2;
  fVar1 = v->y;
  pfVar2 = AffineMatrix4T<float>::At(m,1,1);
  *pfVar2 = fVar1 * *pfVar2;
  fVar1 = v->y;
  pfVar2 = AffineMatrix4T<float>::At(m,2,1);
  *pfVar2 = fVar1 * *pfVar2;
  fVar1 = v->z;
  pfVar2 = AffineMatrix4T<float>::At(m,0,2);
  *pfVar2 = fVar1 * *pfVar2;
  fVar1 = v->z;
  pfVar2 = AffineMatrix4T<float>::At(m,1,2);
  *pfVar2 = fVar1 * *pfVar2;
  fVar1 = v->z;
  pfVar2 = AffineMatrix4T<float>::At(m,2,2);
  *pfVar2 = fVar1 * *pfVar2;
  return;
}

Assistant:

void Scale3x3(M& m, const Vector3T<T>& v)
{
    GS_ASSERT_MxN_MATRIX("scale with 3D vector", M, 3, 3);

    m.At(0, 0) *= v.x;
    m.At(1, 0) *= v.x;
    m.At(2, 0) *= v.x;

    m.At(0, 1) *= v.y;
    m.At(1, 1) *= v.y;
    m.At(2, 1) *= v.y;

    m.At(0, 2) *= v.z;
    m.At(1, 2) *= v.z;
    m.At(2, 2) *= v.z;
}